

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

uint64_t LD_AwareHash_debug(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  byte bVar1;
  
  if (n != 0) {
    do {
      fprintf(_stderr,"    %lu %lu %lu %u\n",n,hash,scale,(ulong)*data);
      bVar1 = *data;
      data = data + 1;
      hash = hash * scale + (ulong)bVar1;
      fprintf(_stderr,"        internal %lu\n",hash);
      n = n - 1;
    } while (n != 0);
  }
  return hash ^ hardener;
}

Assistant:

uint64_t LD_AwareHash_debug(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	while (n) {
		fprintf(stderr, "    %lu %lu %lu %u\n", n, hash, scale, *data);
		hash *= scale;
		hash += *data++;
		n--;
		fprintf(stderr, "        internal %lu\n", hash);
	}
	return hash ^ hardener;
}